

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O1

TidyMessageArgument prvTidygetNextMessageArgument(TidyMessageImpl message,TidyIterator *iter)

{
  TidyMessageArgument p_Var1;
  TidyMessageArgument p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var1 = (TidyMessageArgument)*iter;
    if (p_Var1 == (TidyMessageArgument)0x0) {
      p_Var2 = (TidyMessageArgument)0x0;
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      p_Var2 = (TidyMessageArgument)0x0;
      if (p_Var1 <= (TidyMessageArgument)(long)message.argcount) {
        p_Var2 = p_Var1;
      }
      p_Var3 = (TidyIterator)
               ((long)&p_Var1->_opaque +
               (ulong)(p_Var1 <= (TidyMessageArgument)(long)message.argcount));
    }
    p_Var4 = (TidyIterator)0x0;
    if (p_Var3 <= (TidyIterator)(long)message.argcount) {
      p_Var4 = p_Var3;
    }
    *iter = p_Var4;
    return p_Var2;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                ,0x195,
                "TidyMessageArgument prvTidygetNextMessageArgument(TidyMessageImpl, TidyIterator *)"
               );
}

Assistant:

TidyMessageArgument TY_(getNextMessageArgument)( TidyMessageImpl message, TidyIterator* iter )
{
    size_t item = 0;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex >= 1 && itemIndex <= (size_t)message.argcount )
    {
        item = itemIndex;
        itemIndex++;
    }
    
    /* Just as TidyIterator is really just a dumb, one-based index, the
       TidyMessageArgument is really just a dumb, zero-based index; however
       this type of iterator and opaque interrogation is simply how Tidy
       does things. */
    *iter = (TidyIterator)( itemIndex <= (size_t)message.argcount ? itemIndex : (size_t)0 );
    return (TidyMessageArgument)item;
}